

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int ssl_calc_verify_tls_sha256(mbedtls_ssl_context *ssl,uchar *hash,size_t *hlen)

{
  byte bVar1;
  int iVar2;
  mbedtls_md_info_t *pmVar3;
  mbedtls_md_context_t *ctx;
  undefined1 local_48 [8];
  mbedtls_md_context_t cloned_ctx;
  
  ctx = &ssl->handshake->fin_sha256;
  mbedtls_md_init((mbedtls_md_context_t *)local_48);
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
             ,0x19fd,"=> calc verify");
  pmVar3 = mbedtls_md_info_from_ctx(ctx);
  iVar2 = mbedtls_md_setup((mbedtls_md_context_t *)local_48,pmVar3,0);
  if (((iVar2 == 0) && (iVar2 = mbedtls_md_clone((mbedtls_md_context_t *)local_48,ctx), iVar2 == 0))
     && (iVar2 = mbedtls_md_finish((mbedtls_md_context_t *)local_48,hash), iVar2 == 0)) {
    pmVar3 = mbedtls_md_info_from_ctx(ctx);
    bVar1 = mbedtls_md_get_size(pmVar3);
    *hlen = (ulong)bVar1;
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x1a0f,"calculated verify result",hash,(ulong)bVar1);
    iVar2 = 0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x1a10,"<= calc verify");
  }
  mbedtls_md_free((mbedtls_md_context_t *)local_48);
  return iVar2;
}

Assistant:

int ssl_calc_verify_tls_sha256(const mbedtls_ssl_context *ssl,
                               unsigned char *hash,
                               size_t *hlen)
{
#if defined(MBEDTLS_USE_PSA_CRYPTO)
    return ssl_calc_verify_tls_psa(ssl, &ssl->handshake->fin_sha256_psa, 32,
                                   hash, hlen);
#else
    return ssl_calc_verify_tls_legacy(ssl, &ssl->handshake->fin_sha256,
                                      hash, hlen);
#endif /* MBEDTLS_USE_PSA_CRYPTO */
}